

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void dash_traverse_func(void *closure,plutovg_path_command_t command,plutovg_point_t *points,
                       int npoints)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float local_5c;
  float local_58;
  plutovg_point_t p;
  float a;
  float dist1;
  float dist0;
  float dy;
  float dx;
  plutovg_point_t p1;
  plutovg_point_t p0;
  dasher_t *dasher;
  int npoints_local;
  plutovg_point_t *points_local;
  plutovg_path_command_t command_local;
  void *closure_local;
  
  if (command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
    if ((*(byte *)((long)closure + 0x1c) & 1) != 0) {
      (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),0,points,npoints);
    }
    *(plutovg_point_t *)((long)closure + 0x20) = *points;
    *(undefined4 *)((long)closure + 0x10) = *(undefined4 *)((long)closure + 0xc);
    *(undefined4 *)((long)closure + 0x18) = *(undefined4 *)((long)closure + 0x14);
    *(byte *)((long)closure + 0x1d) = *(byte *)((long)closure + 0x1c) & 1;
  }
  else {
    if ((command != PLUTOVG_PATH_COMMAND_LINE_TO) && (command != PLUTOVG_PATH_COMMAND_CLOSE)) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-path.c"
                    ,0x22b,
                    "void dash_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    p1 = *(plutovg_point_t *)((long)closure + 0x20);
    _dy = *points;
    fVar1 = dy - p1.x;
    fVar2 = dx - p1.y;
    fVar3 = sqrtf(fVar1 * fVar1 + fVar2 * fVar2);
    p.y = 0.0;
    while( true ) {
      if (fVar3 - p.y <=
          *(float *)(*closure +
                    (long)(*(int *)((long)closure + 0x18) % *(int *)((long)closure + 8)) * 4) -
          *(float *)((long)closure + 0x10)) break;
      p.y = (*(float *)(*closure +
                       (long)(*(int *)((long)closure + 0x18) % *(int *)((long)closure + 8)) * 4) -
            *(float *)((long)closure + 0x10)) + p.y;
      p.x = p.y / fVar3;
      local_5c = p.x * fVar1 + p1.x;
      local_58 = p.x * fVar2 + p1.y;
      if ((*(byte *)((long)closure + 0x1d) & 1) == 0) {
        (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),0,&local_5c,1);
      }
      else {
        (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),1,&local_5c);
      }
      *(undefined4 *)((long)closure + 0x10) = 0;
      *(byte *)((long)closure + 0x1d) = (*(byte *)((long)closure + 0x1d) ^ 0xff) & 1;
      *(int *)((long)closure + 0x18) = *(int *)((long)closure + 0x18) + 1;
    }
    if ((*(byte *)((long)closure + 0x1d) & 1) != 0) {
      (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),1,&dy);
    }
    *(float *)((long)closure + 0x10) = (fVar3 - p.y) + *(float *)((long)closure + 0x10);
    *(plutovg_point_t *)((long)closure + 0x20) = _dy;
  }
  return;
}

Assistant:

static void dash_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    dasher_t* dasher = (dasher_t*)(closure);
    if(command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
        if(dasher->start_toggle)
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, npoints);
        dasher->current_point = points[0];
        dasher->phase = dasher->start_phase;
        dasher->index = dasher->start_index;
        dasher->toggle = dasher->start_toggle;
        return;
    }

    assert(command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE);
    plutovg_point_t p0 = dasher->current_point;
    plutovg_point_t p1 = points[0];
    float dx = p1.x - p0.x;
    float dy = p1.y - p0.y;
    float dist0 = sqrtf(dx*dx + dy*dy);
    float dist1 = 0.f;
    while(dist0 - dist1 > dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase) {
        dist1 += dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase;
        float a = dist1 / dist0;
        plutovg_point_t p = { p0.x + a * dx, p0.y + a * dy };
        if(dasher->toggle) {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
        } else {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, &p, 1);
        }

        dasher->phase = 0.f;
        dasher->toggle = !dasher->toggle;
        dasher->index++;
    }

    if(dasher->toggle) {
        dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p1, 1);
    }

    dasher->phase += dist0 - dist1;
    dasher->current_point = p1;
}